

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writers.h
# Opt level: O3

void date::number_writer<0>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>
               (ostreambuf_iterator<char,_std::char_traits<char>_> *dst,int value)

{
  if (value != 0) {
    write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>(dst,value / 10);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,"0123456789"[value % 10])
    ;
    return;
  }
  return;
}

Assistant:

static void write(Iterator& dst, Number value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto digits = number_writer<0>::digits<char_type>();
        if (value == 0)
            return;
        number_writer<0>::write(dst, value / 10);
        *(dst++) = digits[value % 10];
    }